

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Scanner::Scanner(Scanner *this,char *input_f)

{
  FILE *pFVar1;
  Exception *this_00;
  allocator_type local_2d;
  Lex local_2c;
  
  (this->buffer)._M_dataplus._M_p = (pointer)&(this->buffer).field_2;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  Lex::Lex(&local_2c);
  std::vector<Lex,_std::allocator<Lex>_>::vector(&this->lex_vec,0,&local_2c,&local_2d);
  Lex::~Lex(&local_2c);
  pFVar1 = fopen(input_f,"r");
  this->f = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    (this->buffer)._M_string_length = 0;
    *(this->buffer)._M_dataplus._M_p = '\0';
    this->STATE = H_ST;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  Exception::Exception(this_00,"Scanner error: could not open file",'\0');
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Scanner::Scanner(const char* input_f): lex_vec(0, Lex()){
    f = fopen(input_f, "r");
    if(f == NULL) throw Exception("Scanner error: could not open file");
    clear_buffer();
    STATE = H_ST;
}